

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O2

char * QTest::toString(QObject *o)

{
  undefined8 uVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_50;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (o == (QObject *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      pcVar2 = (char *)qstrdup("<null>");
      return pcVar2;
    }
  }
  else {
    QObject::objectName();
    (*(code *)**(undefined8 **)o)(o);
    uVar1 = QMetaObject::className();
    pcVar2 = (char *)operator_new__(0x100);
    if (local_38.size == 0) {
      snprintf(pcVar2,0x100,"%s/%p",uVar1,o);
    }
    else {
      QString::toLocal8Bit((QByteArray *)&local_50,(QString *)&local_38);
      if (local_50.ptr == (char *)0x0) {
        local_50.ptr = (char *)&QByteArray::_empty;
      }
      snprintf(pcVar2,0x100,"%s/\"%s\"",uVar1,local_50.ptr);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return pcVar2;
    }
  }
  __stack_chk_fail();
}

Assistant:

char *QTest::toString(const QObject *o)
{
    if (o == nullptr)
        return qstrdup("<null>");

    const QString &name = o->objectName();
    const char *className = o->metaObject()->className();
    char *msg = new char[256];
    if (name.isEmpty())
        std::snprintf(msg, 256, "%s/%p", className, o);
    else
        std::snprintf(msg, 256, "%s/\"%s\"", className, qPrintable(name));
    return msg;
}